

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O1

PyObject * EventVecToDict::convert(vector<EventDataType,_std::allocator<EventDataType>_> *vec)

{
  long lVar1;
  list *this;
  ulong uVar2;
  long lVar3;
  dict d;
  object_base local_70;
  object_base local_68;
  object local_60;
  object_base local_58;
  string local_50;
  
  this = (list *)operator_new(8);
  boost::python::detail::list_base::list_base((list_base *)this);
  if ((vec->super__Vector_base<EventDataType,_std::allocator<EventDataType>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (vec->super__Vector_base<EventDataType,_std::allocator<EventDataType>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      boost::python::detail::dict_base::dict_base((dict_base *)&local_58);
      EventDataType::getName_abi_cxx11_
                (&local_50,
                 (EventDataType *)
                 ((long)&(((vec->super__Vector_base<EventDataType,_std::allocator<EventDataType>_>).
                           _M_impl.super__Vector_impl_data._M_start)->super_NetworkDataType).
                         _vptr_NetworkDataType + lVar3));
      local_68.m_ptr =
           boost::python::api::object_initializer_impl<false,_false>::get<char[6]>("event");
      (local_58.m_ptr)->ob_refcnt = (local_58.m_ptr)->ob_refcnt + 1;
      local_70.m_ptr = local_58.m_ptr;
      lVar1 = (local_68.m_ptr)->ob_refcnt;
      (local_68.m_ptr)->ob_refcnt = lVar1 + 1;
      (local_68.m_ptr)->ob_refcnt = lVar1;
      if (lVar1 == 0) {
        _Py_Dealloc(local_68.m_ptr);
      }
      local_60.super_object_base.m_ptr =
           (object_base)
           boost::python::api::object_initializer_impl<false,false>::get<std::__cxx11::string>
                     (&local_50);
      boost::python::api::setitem((object *)&local_70,(object *)&local_68,&local_60);
      *(long *)local_60.super_object_base.m_ptr = *(long *)local_60.super_object_base.m_ptr + -1;
      if (*(long *)local_60.super_object_base.m_ptr == 0) {
        _Py_Dealloc();
      }
      (local_68.m_ptr)->ob_refcnt = (local_68.m_ptr)->ob_refcnt + -1;
      if ((local_68.m_ptr)->ob_refcnt == 0) {
        _Py_Dealloc();
      }
      (local_70.m_ptr)->ob_refcnt = (local_70.m_ptr)->ob_refcnt + -1;
      if ((local_70.m_ptr)->ob_refcnt == 0) {
        _Py_Dealloc();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      EventDataType::getOrigin_abi_cxx11_
                (&local_50,
                 (EventDataType *)
                 ((long)&(((vec->super__Vector_base<EventDataType,_std::allocator<EventDataType>_>).
                           _M_impl.super__Vector_impl_data._M_start)->super_NetworkDataType).
                         _vptr_NetworkDataType + lVar3));
      local_68.m_ptr =
           boost::python::api::object_initializer_impl<false,_false>::get<char[7]>("origin");
      (local_58.m_ptr)->ob_refcnt = (local_58.m_ptr)->ob_refcnt + 1;
      local_70.m_ptr = local_58.m_ptr;
      lVar1 = (local_68.m_ptr)->ob_refcnt;
      (local_68.m_ptr)->ob_refcnt = lVar1 + 1;
      (local_68.m_ptr)->ob_refcnt = lVar1;
      if (lVar1 == 0) {
        _Py_Dealloc(local_68.m_ptr);
      }
      local_60.super_object_base.m_ptr =
           (object_base)
           boost::python::api::object_initializer_impl<false,false>::get<std::__cxx11::string>
                     (&local_50);
      boost::python::api::setitem((object *)&local_70,(object *)&local_68,&local_60);
      *(long *)local_60.super_object_base.m_ptr = *(long *)local_60.super_object_base.m_ptr + -1;
      if (*(long *)local_60.super_object_base.m_ptr == 0) {
        _Py_Dealloc();
      }
      (local_68.m_ptr)->ob_refcnt = (local_68.m_ptr)->ob_refcnt + -1;
      if ((local_68.m_ptr)->ob_refcnt == 0) {
        _Py_Dealloc();
      }
      (local_70.m_ptr)->ob_refcnt = (local_70.m_ptr)->ob_refcnt + -1;
      if ((local_70.m_ptr)->ob_refcnt == 0) {
        _Py_Dealloc();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      boost::python::list::append<boost::python::dict>(this,(dict *)&local_58);
      (local_58.m_ptr)->ob_refcnt = (local_58.m_ptr)->ob_refcnt + -1;
      if ((local_58.m_ptr)->ob_refcnt == 0) {
        _Py_Dealloc();
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x48;
    } while (uVar2 < (ulong)(((long)(vec->
                                    super__Vector_base<EventDataType,_std::allocator<EventDataType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(vec->
                                    super__Vector_base<EventDataType,_std::allocator<EventDataType>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x71c71c71c71c71c7));
  }
  return (this->super_list_base).super_object.super_object_base.m_ptr;
}

Assistant:

static PyObject* convert(const std::vector<EventDataType>& vec){
        list* l = new list();
        for(size_t i = 0; i < vec.size(); i++){
            dict d;
            d["event"] = vec[i].getName();
            d["origin"] = vec[i].getOrigin();
            l->append(d);
        }
        return l->ptr();
    }